

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 451.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<7,_451>::Type(Type<7,_451> *this,Type<7,_451> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)
           &(param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).field_0x4;
  dVar1 = (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_ =
       (param_1->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_;
  *(undefined4 *)&(this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).field_0x4 =
       uVar2;
  (this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_ = dVar1;
  std::
  vector<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
  ::vector(&this->elements_,&param_1->elements_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 7, 451 > : 
    protected BaseWithoutMT< Type< 7, 451 > > {

    friend BaseWithoutMT< Type< 7, 451 > >;

  public:

    #include "ENDFtk/section/7/451/ElementInformation.hpp"

  private:

    /* fields */
    std::vector< ElementInformation > elements_;

    /* auxiliary functions */
    #include "ENDFtk/section/7/451/src/verifySize.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/7/451/src/ctor.hpp"

    /* get methods */

    /**
     *  @brief Return the number of elements
     */
    unsigned int NA() const { return this->elements_.size(); }

    /**
     *  @brief Return the number of elements
     */
    unsigned int numberElements() const { return this->NA(); }

    /**
     *  @brief Return the element data
     */
    auto elements() const {

      return ranges::cpp20::views::all( this->elements_ );
    }

    #include "ENDFtk/section/7/451/src/NC.hpp"
    #include "ENDFtk/section/7/451/src/print.hpp"

    /**
     *  @brief Return the MT number of the section
     */
    static constexpr int sectionNumber() { return 451; }

    using BaseWithoutMT::MT;
    using BaseWithoutMT::ZA;
    using BaseWithoutMT::targetIdentifier;
    using BaseWithoutMT::AWR;
    using BaseWithoutMT::atomicWeightRatio;
  }